

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O0

BVec2 __thiscall deqp::egl::ConfigFilter::getSpecifiedLuminanceColors(ConfigFilter *this)

{
  bool *pbVar1;
  ConfigFilter *in_RSI;
  AttribRule AVar2;
  int iStack_38;
  EGLint value;
  EGLenum attrib;
  int ndx;
  EGLenum bitAttribs [2];
  ConfigFilter *this_local;
  BVec2 *result;
  
  _attrib = 0x30210000303d;
  tcu::Vector<bool,_2>::Vector((Vector<bool,_2> *)this);
  for (value = 0; value < 2; value = value + 1) {
    AVar2 = getAttribute(in_RSI,(&attrib)[value]);
    iStack_38 = AVar2.value;
    if ((iStack_38 == 0) || (iStack_38 == -1)) {
      pbVar1 = tcu::Vector<bool,_2>::operator[]((Vector<bool,_2> *)this,value);
      *pbVar1 = false;
    }
    else {
      pbVar1 = tcu::Vector<bool,_2>::operator[]((Vector<bool,_2> *)this,value);
      *pbVar1 = true;
    }
  }
  return (BVec2)SUB82(this,0);
}

Assistant:

tcu::BVec2 getSpecifiedLuminanceColors (void) const
	{
		const EGLenum bitAttribs[] =
		{
			EGL_LUMINANCE_SIZE,
			EGL_ALPHA_SIZE
		};

		tcu::BVec2 result;

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(bitAttribs); ndx++)
		{
			const EGLenum	attrib	= bitAttribs[ndx];
			const EGLint	value	= getAttribute(attrib).value;

			if (value != 0 && value != EGL_DONT_CARE)
				result[ndx] = true;
			else
				result[ndx] = false;
		}

		return result;
	}